

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* QPDFCryptoProvider::getRegisteredImpls_abi_cxx11_(void)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
  *pmVar1;
  _Base_ptr p_Var2;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *in_RDI;
  
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    **)(in_RDI + 0x18) = in_RDI + 8;
  *(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    **)(in_RDI + 0x20) = in_RDI + 8;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  getInstance();
  pmVar1 = &(getInstance::instance.m.
             super___shared_ptr<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            providers;
  for (p_Var2 = ((getInstance::instance.m.
                  super___shared_ptr<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var2 + 1));
  }
  return (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::set<std::string>
QPDFCryptoProvider::getRegisteredImpls()
{
    std::set<std::string> result;
    QPDFCryptoProvider& p = getInstance();
    for (auto const& iter: p.m->providers) {
        result.insert(iter.first);
    }
    return result;
}